

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.h
# Opt level: O0

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestStartCommand::Clone(cmCTestStartCommand *this)

{
  byte bVar1;
  cmCTest *pcVar2;
  cmCTestScriptHandler *pcVar3;
  pointer pcVar4;
  long in_RSI;
  unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_> local_20;
  __single_object ni;
  cmCTestStartCommand *this_local;
  
  std::make_unique<cmCTestStartCommand>();
  pcVar2 = *(cmCTest **)(in_RSI + 0x18);
  pcVar4 = std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::
           operator->(&local_20);
  (pcVar4->super_cmCTestCommand).CTest = pcVar2;
  pcVar3 = *(cmCTestScriptHandler **)(in_RSI + 0x20);
  pcVar4 = std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::
           operator->(&local_20);
  (pcVar4->super_cmCTestCommand).CTestScriptHandler = pcVar3;
  bVar1 = *(byte *)(in_RSI + 0x28);
  pcVar4 = std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::
           operator->(&local_20);
  pcVar4->CreateNewTag = (bool)(bVar1 & 1);
  bVar1 = *(byte *)(in_RSI + 0x29);
  pcVar4 = std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::
           operator->(&local_20);
  pcVar4->Quiet = (bool)(bVar1 & 1);
  std::unique_ptr<cmCommand,std::default_delete<cmCommand>>::
  unique_ptr<cmCTestStartCommand,std::default_delete<cmCTestStartCommand>,void>
            ((unique_ptr<cmCommand,std::default_delete<cmCommand>> *)this,&local_20);
  std::unique_ptr<cmCTestStartCommand,_std::default_delete<cmCTestStartCommand>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestStartCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    ni->CreateNewTag = this->CreateNewTag;
    ni->Quiet = this->Quiet;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }